

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecompressToYUVPlanes
              (tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar **dstPlanes,int width,
              int *strides,int height,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  code **ppcVar10;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  long lVar14;
  void *pvVar15;
  tjinstance *this;
  char *pcVar16;
  ulong uVar17;
  long lVar18;
  uchar *puVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  void *pvVar23;
  long lVar24;
  int iVar25;
  size_t sVar26;
  ulong uVar27;
  long *in_FS_OFFSET;
  bool bVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *outbuf [10];
  int th [10];
  int crow [10];
  int iw [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  my_progress_mgr progress;
  long local_238 [20];
  uint auStack_198 [12];
  int aiStack_168 [12];
  int aiStack_138 [12];
  uint auStack_108 [12];
  int aiStack_d8 [12];
  JSAMPARRAY local_a8 [10];
  code *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    *(undefined8 *)((long)in_FS_OFFSET + -0xc9) = 0x656c646e616820;
    in_FS_OFFSET[-0x1a] = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_238[8] = 0;
  local_238[9] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[10] = 0;
  local_238[0xb] = 0;
  local_238[0xc] = 0;
  local_238[0xd] = 0;
  local_238[0xe] = 0;
  local_238[0xf] = 0;
  local_238[0x10] = 0;
  local_238[0x11] = 0;
  local_238[0x12] = 0;
  local_238[0x13] = 0;
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",0x4f);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    memcpy((void *)(*in_FS_OFFSET + -0xd0),
           "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",0x4f);
  }
  else {
    if (((dstPlanes != (uchar **)0x0 && (jpegSize != 0 && jpegBuf != (uchar *)0x0)) &&
        (-1 < (height | width))) && (*dstPlanes != (uchar *)0x0)) {
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar16 = "JSIMD_FORCESSE=1";
          goto LAB_00110456;
        }
        if ((flags & 0x20U) != 0) {
          pcVar16 = "JSIMD_FORCESSE2=1";
          goto LAB_00110456;
        }
      }
      else {
        pcVar16 = "JSIMD_FORCEMMX=1";
LAB_00110456:
        putenv(pcVar16);
      }
      if ((short)flags < 0) {
        ppcVar10 = &local_58;
        uStack_50 = 0;
        local_48 = 0;
        uStack_40 = 0;
        local_58 = my_progress_monitor;
        local_38 = handle;
      }
      else {
        ppcVar10 = (code **)0x0;
      }
      *(code ***)((long)handle + 0x218) = ppcVar10;
      iVar4 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar4 != 0) {
        pvVar23 = (void *)0x0;
        uVar7 = 0xffffffff;
        goto LAB_001103d0;
      }
      if (*(int *)((long)handle + 0x604) == 0) {
        jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
        jpeg_read_header(cinfo,1);
      }
      *(undefined4 *)((long)handle + 0x604) = 0;
      iVar4 = getSubsamp(cinfo);
      if (iVar4 < 0) {
        pcVar16 = "tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image";
        sVar26 = 0x4f;
LAB_0011064c:
        memcpy((void *)((long)handle + 0x608),pcVar16,sVar26);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        memcpy((void *)(*in_FS_OFFSET + -0xd0),pcVar16,sVar26);
      }
      else {
        if ((iVar4 == 3) || ((dstPlanes[1] != (uchar *)0x0 && (dstPlanes[2] != (uchar *)0x0)))) {
          if (width == 0) {
            width = *(int *)((long)handle + 0x238);
          }
          if (height == 0) {
            height = *(int *)((long)handle + 0x23c);
          }
          lVar14 = 0;
          do {
            iVar1 = sf[lVar14].denom;
            if (((sf[lVar14].num * *(int *)((long)handle + 0x238) + iVar1 + -1) / iVar1 <= width) &&
               ((iVar1 + sf[lVar14].num * *(int *)((long)handle + 0x23c) + -1) / iVar1 <= height)) {
              uVar7 = (uint)lVar14;
              goto LAB_00110614;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 0x10);
          uVar7 = 0x10;
LAB_00110614:
          if (uVar7 < 0x10) {
            if (*(int *)((long)handle + 0x240) < 4) {
              iVar1 = sf[uVar7].num;
              iVar2 = sf[uVar7].denom;
              *(int *)((long)handle + 0x24c) = iVar1;
              *(int *)((long)handle + 0x250) = iVar2;
              jpeg_calc_output_dimensions(cinfo);
              iVar5 = (iVar1 * 8) / iVar2;
              uVar22 = *(uint *)((long)handle + 0x240);
              if ((int)uVar22 < 1) {
                bVar28 = true;
                sVar26 = 0;
                uVar7 = 0;
              }
              else {
                lVar14 = *in_FS_OFFSET;
                uVar27 = 0;
                uVar21 = uVar27;
                uVar17 = uVar27;
                uVar11 = uVar27;
                do {
                  lVar18 = *(long *)((long)handle + 0x338);
                  lVar24 = uVar21 * 0x60;
                  iVar25 = *(int *)(lVar18 + 0x1c + lVar24) * iVar5;
                  aiStack_138[uVar21] = iVar25;
                  iVar8 = *(int *)(lVar18 + 0x20 + lVar24);
                  iVar6 = tjPlaneWidth((int)uVar21,*(int *)((long)handle + 0x290),iVar4);
                  aiStack_d8[uVar21] = iVar6;
                  uVar7 = tjPlaneHeight((int)uVar21,*(int *)((long)handle + 0x294),iVar4);
                  uVar3 = (uint)uVar27;
                  if (iVar8 * iVar5 != uVar7 || iVar25 != iVar6) {
                    uVar3 = 1;
                  }
                  uVar27 = (ulong)uVar3;
                  auStack_108[uVar21] = uVar7;
                  uVar22 = *(int *)(lVar18 + 0xc + lVar24) * iVar5;
                  auStack_198[uVar21] = uVar22;
                  pvVar23 = malloc((long)(int)uVar7 << 3);
                  local_238[uVar21 + 10] = (long)pvVar23;
                  if (pvVar23 == (void *)0x0) {
                    builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
                    builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
                    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
                    builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
                    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
                    builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
                    *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
                    *(undefined4 *)((long)handle + 0x6d0) = 1;
                    *(undefined8 *)(lVar14 + -0xa3) = 0x6572756c696166;
                    builtin_strncpy((char *)(lVar14 + -0xb0),"y alloca",8);
                    builtin_strncpy((char *)(lVar14 + -0xa8),"tion fai",8);
                    builtin_strncpy((char *)(lVar14 + -0xc0),"VPlanes(",8);
                    builtin_strncpy((char *)(lVar14 + -0xb8),"): Memor",8);
                    builtin_strncpy((char *)(lVar14 + -0xd0),"tjDecomp",8);
                    builtin_strncpy((char *)(lVar14 + -200),"ressToYU",8);
                    iVar8 = 5;
                    uVar11 = 0xffffffff;
                  }
                  else {
                    iVar8 = 0;
                    if (0 < (int)uVar7) {
                      puVar19 = dstPlanes[uVar21];
                      uVar20 = 0;
                      do {
                        *(uchar **)((long)pvVar23 + uVar20 * 8) = puVar19;
                        if ((strides == (int *)0x0) ||
                           (iVar9 = strides[uVar21], strides[uVar21] == 0)) {
                          iVar9 = iVar6;
                        }
                        puVar19 = puVar19 + iVar9;
                        uVar20 = uVar20 + 1;
                      } while (uVar7 != uVar20);
                    }
                  }
                  uVar7 = (uint)uVar11;
                  if (iVar8 != 0) {
                    if (iVar8 != 5) {
                      return uVar7;
                    }
                    pvVar23 = (void *)0x0;
                    goto LAB_001103d0;
                  }
                  uVar13 = (int)uVar17 + uVar22 * iVar25;
                  uVar21 = uVar21 + 1;
                  uVar22 = *(uint *)((long)handle + 0x240);
                  uVar17 = (ulong)uVar13;
                } while ((long)uVar21 < (long)(int)uVar22);
                bVar28 = uVar3 == 0;
                sVar26 = (size_t)(int)uVar13;
              }
              if (bVar28) {
                pvVar23 = (void *)0x0;
              }
              else {
                pvVar23 = malloc(sVar26);
                if (pvVar23 == (void *)0x0) {
                  builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
                  builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
                  uVar29._0_1_ = ')';
                  uVar29._1_1_ = ':';
                  uVar29._2_1_ = ' ';
                  uVar29._3_1_ = 'M';
                  uVar30._0_1_ = 'e';
                  uVar30._1_1_ = 'm';
                  uVar30._2_1_ = 'o';
                  uVar30._3_1_ = 'r';
                  builtin_strncpy((char *)((long)handle + 0x618),"VPla",4);
                  builtin_strncpy((char *)((long)handle + 0x61c),"nes(",4);
                  builtin_strncpy((char *)((long)handle + 0x620),"): M",4);
                  builtin_strncpy((char *)((long)handle + 0x624),"emor",4);
                  builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
                  builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
                  builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
                  builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
                  *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
                  *(undefined4 *)((long)handle + 0x6d0) = 1;
                  *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
                  in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
                  in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
                  goto LAB_001105fd;
                }
                if (0 < (int)uVar22) {
                  uVar21 = 0;
                  pvVar15 = pvVar23;
                  do {
                    uVar3 = auStack_198[uVar21];
                    pvVar12 = malloc((long)(int)uVar3 * 8);
                    local_238[uVar21] = (long)pvVar12;
                    if (pvVar12 == (void *)0x0) {
                      builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
                      builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
                      builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
                      builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
                      builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
                      builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
                      *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
                      *(undefined4 *)((long)handle + 0x6d0) = 1;
                      *(undefined8 *)((long)in_FS_OFFSET + -0xa3) = 0x6572756c696166;
                      in_FS_OFFSET[-0x16] = 0x61636f6c6c612079;
                      in_FS_OFFSET[-0x15] = 0x696166206e6f6974;
                      in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
                      in_FS_OFFSET[-0x17] = 0x726f6d654d203a29;
                      in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
                      in_FS_OFFSET[-0x19] = 0x55596f5473736572;
                      uVar7 = 0xffffffff;
                      goto LAB_001103d0;
                    }
                    if (0 < (int)uVar3) {
                      iVar8 = aiStack_138[uVar21];
                      lVar14 = 0;
                      do {
                        *(void **)((long)pvVar12 + lVar14 * 8) = pvVar15;
                        pvVar15 = (void *)((long)pvVar15 + (long)iVar8);
                        lVar14 = lVar14 + 1;
                      } while ((int)uVar3 != lVar14);
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar22);
                }
              }
              iVar8 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
              if (iVar8 == 0) {
                if (((uint)flags >> 8 & 1) != 0) {
                  *(undefined4 *)((long)handle + 0x26c) = 0;
                }
                if (((uint)flags >> 0xb & 1) != 0) {
                  *(undefined4 *)((long)handle + 0x268) = 1;
                }
                *(undefined4 *)((long)handle + 0x264) = 1;
                jpeg_start_decompress(cinfo);
                if (0 < *(int *)((long)handle + 0x294)) {
                  iVar8 = 0;
                  do {
                    iVar6 = *(int *)((long)handle + 0x240);
                    if (0 < (long)iVar6) {
                      iVar25 = *(int *)((long)handle + 0x3a4);
                      lVar18 = 3;
                      lVar14 = 0;
                      do {
                        lVar24 = *(long *)((long)handle + 0x338);
                        if (iVar4 == 2) {
                          *(int *)(lVar24 + 0x18 + lVar18 * 4) = iVar5;
                          *(int *)(lVar24 + 0x34 + lVar18 * 4) =
                               (((iVar1 << 4) / iVar2) * *(int *)(lVar24 + lVar18 * 4)) /
                               *(int *)((long)handle + 0x3a4);
                          *(undefined8 *)(*(long *)((long)handle + 0x460) + 8 + lVar14 * 2) =
                               *(undefined8 *)(*(long *)((long)handle + 0x460) + 8);
                        }
                        iVar9 = (*(int *)(lVar24 + lVar18 * 4) * iVar8) / iVar25;
                        *(int *)((long)aiStack_168 + lVar14) = iVar9;
                        if (bVar28) {
                          lVar24 = (long)iVar9 * 8 + *(long *)((long)local_238 + lVar14 * 2 + 0x50);
                        }
                        else {
                          lVar24 = *(long *)((long)local_238 + lVar14 * 2);
                        }
                        *(long *)((long)local_a8 + lVar14 * 2) = lVar24;
                        lVar14 = lVar14 + 4;
                        lVar18 = lVar18 + 0x18;
                      } while ((long)iVar6 * 4 != lVar14);
                    }
                    jpeg_read_raw_data(cinfo,local_a8,
                                       *(int *)((long)handle + 0x3a8) *
                                       *(int *)((long)handle + 0x3a4));
                    if ((!bVar28) && (0 < *(int *)((long)handle + 0x240))) {
                      lVar14 = 0;
                      do {
                        iVar6 = aiStack_168[lVar14];
                        uVar22 = auStack_108[lVar14] - iVar6;
                        if ((int)auStack_198[lVar14] < (int)uVar22) {
                          uVar22 = auStack_198[lVar14];
                        }
                        if (0 < (int)uVar22) {
                          lVar18 = local_238[lVar14];
                          iVar25 = aiStack_d8[lVar14];
                          lVar24 = local_238[lVar14 + 10];
                          uVar21 = 0;
                          do {
                            memcpy(*(void **)((long)iVar6 * 8 + lVar24 + uVar21 * 8),
                                   *(void **)(lVar18 + uVar21 * 8),(long)iVar25);
                            uVar21 = uVar21 + 1;
                          } while (uVar22 != uVar21);
                        }
                        lVar14 = lVar14 + 1;
                      } while (lVar14 < *(int *)((long)handle + 0x240));
                    }
                    iVar8 = *(int *)((long)handle + 0x3a8) * *(int *)((long)handle + 0x3a4) + iVar8;
                  } while (iVar8 < *(int *)((long)handle + 0x294));
                }
                jpeg_finish_decompress(cinfo);
              }
              else {
                uVar7 = 0xffffffff;
              }
              goto LAB_001103d0;
            }
            pcVar16 = "tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components";
            sVar26 = 0x46;
          }
          else {
            pcVar16 = "tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions";
            sVar26 = 0x4c;
          }
          goto LAB_0011064c;
        }
        builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
        builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
        uVar29._0_1_ = ')';
        uVar29._1_1_ = ':';
        uVar29._2_1_ = ' ';
        uVar29._3_1_ = 'I';
        uVar30._0_1_ = 'n';
        uVar30._1_1_ = 'v';
        uVar30._2_1_ = 'a';
        uVar30._3_1_ = 'l';
        builtin_strncpy((char *)((long)handle + 0x618),"VPla",4);
        builtin_strncpy((char *)((long)handle + 0x61c),"nes(",4);
        builtin_strncpy((char *)((long)handle + 0x620),"): I",4);
        builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
        builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
        builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
        builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
        *(undefined4 *)((long)handle + 0x6d0) = 1;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
LAB_001105fd:
        *(undefined4 *)(in_FS_OFFSET + -0x18) = 0x616c5056;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xbc),"nes(",4);
        *(undefined4 *)(in_FS_OFFSET + -0x17) = uVar29;
        *(undefined4 *)((long)in_FS_OFFSET + -0xb4) = uVar30;
        *(undefined4 *)(in_FS_OFFSET + -0x1a) = 0x65446a74;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xcc),"comp",4);
        *(undefined4 *)(in_FS_OFFSET + -0x19) = 0x73736572;
        builtin_strncpy((char *)((long)in_FS_OFFSET + -0xc4),"ToYU",4);
      }
      pvVar23 = (void *)0x0;
      uVar7 = 0xffffffff;
      goto LAB_001103d0;
    }
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDecomp",8);
    builtin_strncpy((char *)((long)handle + 0x610),"ressToYU",8);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xb4),"nvalid a",8);
    builtin_strncpy((char *)((long)in_FS_OFFSET + -0xac),"rgument",8);
    in_FS_OFFSET[-0x18] = 0x2873656e616c5056;
    in_FS_OFFSET[-0x17] = 0x6c61766e49203a29;
    in_FS_OFFSET[-0x1a] = 0x706d6f6365446a74;
    in_FS_OFFSET[-0x19] = 0x55596f5473736572;
  }
  uVar7 = 0xffffffff;
  pvVar23 = (void *)0x0;
LAB_001103d0:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  lVar14 = 0;
  do {
    free((void *)local_238[lVar14]);
    free((void *)local_238[lVar14 + 10]);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 10);
  free(pvVar23);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar7;
}

Assistant:

DLLEXPORT int tjDecompressToYUVPlanes(tjhandle handle,
                                      const unsigned char *jpegBuf,
                                      unsigned long jpegSize,
                                      unsigned char **dstPlanes, int width,
                                      int *strides, int height, int flags)
{
  int i, sfi, row, retval = 0;
  int jpegwidth, jpegheight, jpegSubsamp, scaledw, scaledh;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *outbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];
  int dctsize;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || !dstPlanes || !dstPlanes[0] ||
      width < 0 || height < 0)
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (!this->headerRead) {
    jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
    jpeg_read_header(dinfo, TRUE);
  }
  this->headerRead = 0;
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");

  if (jpegSubsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
  if (dinfo->num_components > 3)
    THROW("tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");

  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;
  sfi = i;
  jpeg_calc_output_dimensions(dinfo);

  dctsize = DCTSIZE * sf[sfi].num / sf[sfi].denom;

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * dctsize;
    ih = compptr->height_in_blocks * dctsize;
    pw[i] = tjPlaneWidth(i, dinfo->output_width, jpegSubsamp);
    ph[i] = tjPlaneHeight(i, dinfo->output_height, jpegSubsamp);
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * dctsize;
    tmpbufsize += iw[i] * th[i];
    if ((outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < dinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;
  if (flags & TJFLAG_FASTDCT) dinfo->dct_method = JDCT_FASTEST;
  dinfo->raw_data_out = TRUE;

  jpeg_start_decompress(dinfo);
  for (row = 0; row < (int)dinfo->output_height;
       row += dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < dinfo->num_components; i++) {
      jpeg_component_info *compptr = &dinfo->comp_info[i];

      if (jpegSubsamp == TJ_420) {
        /* When 4:2:0 subsampling is used with IDCT scaling, libjpeg will try
           to be clever and use the IDCT to perform upsampling on the U and V
           planes.  For instance, if the output image is to be scaled by 1/2
           relative to the JPEG image, then the scaling factor and upsampling
           effectively cancel each other, so a normal 8x8 IDCT can be used.
           However, this is not desirable when using the decompress-to-YUV
           functionality in TurboJPEG, since we want to output the U and V
           planes in their subsampled form.  Thus, we have to override some
           internal libjpeg parameters to force it to use the "scaled" IDCT
           functions on the U and V planes. */
        compptr->_DCT_scaled_size = dctsize;
        compptr->MCU_sample_width = tjMCUWidth[jpegSubsamp] *
          sf[sfi].num / sf[sfi].denom *
          compptr->v_samp_factor / dinfo->max_v_samp_factor;
        dinfo->idct->inverse_DCT[i] = dinfo->idct->inverse_DCT[0];
      }
      crow[i] = row * compptr->v_samp_factor / dinfo->max_v_samp_factor;
      if (usetmpbuf) yuvptr[i] = tmpbuf[i];
      else yuvptr[i] = &outbuf[i][crow[i]];
    }
    jpeg_read_raw_data(dinfo, yuvptr,
                       dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size);
    if (usetmpbuf) {
      int j;

      for (i = 0; i < dinfo->num_components; i++) {
        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(outbuf[i][crow[i] + j], tmpbuf[i][j], pw[i]);
        }
      }
    }
  }
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(outbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}